

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_key.c
# Opt level: O1

void get_comm(char **pt,char *kcomm,unsigned_long *stat)

{
  char *__src;
  ushort *puVar1;
  ushort **ppuVar2;
  char cVar3;
  char *pcVar4;
  size_t __n;
  
  __src = *pt;
  if (*__src != '/') {
    *(byte *)((long)stat + 1) = *(byte *)((long)stat + 1) | 4;
  }
  pcVar4 = __src + 1;
  cVar3 = __src[1];
  if (cVar3 != '\0') {
    ppuVar2 = __ctype_b_loc();
    puVar1 = *ppuVar2;
    do {
      if ((*(byte *)((long)puVar1 + (long)cVar3 * 2 + 1) & 0x40) == 0) {
        *(byte *)((long)stat + 1) = *(byte *)((long)stat + 1) | 8;
      }
      cVar3 = pcVar4[1];
      pcVar4 = pcVar4 + 1;
    } while (cVar3 != '\0');
  }
  __n = (size_t)((int)pcVar4 - (int)__src);
  strncpy(kcomm,__src,__n);
  kcomm[__n] = '\0';
  return;
}

Assistant:

void get_comm(char **pt,     		/* card string */
	    char *kcomm,		/* comment string */
	    unsigned long *stat		/* error number */
	   )
{        
    char *pi;
    int nchar = 0;
    char *p; 

    p = *pt;
    pi = p;
    if(*p != '/')  { 
      *stat |= NO_START_SLASH; 
    }
    p++;
    while(*p != '\0') {
        if(!isprint((int)*p) ) *stat |=  BAD_COMMENT;
        p++;
    }
    nchar = p - pi; 
    strncpy(kcomm,pi,nchar);
    *(kcomm+nchar) = '\0';
    return;
}